

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary-ops.cpp
# Opt level: O1

void ggml_compute_forward_sqr(ggml_compute_params *params,ggml_tensor *dst)

{
  uint *puVar1;
  ggml_type gVar2;
  int iVar3;
  int iVar4;
  ggml_type gVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  long lVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  void *pvVar13;
  void *pvVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  byte bVar28;
  byte bVar29;
  char cVar30;
  uint uVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  ulong in_RCX;
  char *pcVar36;
  long lVar37;
  long lVar38;
  ushort uVar39;
  undefined8 uVar40;
  ggml_tensor *pgVar41;
  ggml_tensor *pgVar42;
  ggml_tensor *pgVar43;
  uint uVar44;
  ulong uVar45;
  long in_R9;
  ulong uVar46;
  int64_t ir;
  long lVar47;
  long lVar48;
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  anon_union_4_2_947300a4 u;
  float fVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 auStack_400 [64];
  undefined8 uStack_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 uStack_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 uStack_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 uStack_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 uStack_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 uStack_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  ggml_tensor *pgStack_2a0;
  
  pgVar41 = dst->src[0];
  gVar2 = pgVar41->type;
  if ((gVar2 == GGML_TYPE_F32) && (dst->type == GGML_TYPE_F32)) {
    cVar30 = ggml_is_contiguous_1(pgVar41);
    if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(dst), cVar30 != '\0')) &&
       (cVar30 = ggml_are_same_shape(pgVar41,dst), cVar30 != '\0')) {
      if (dst->nb[0] != 4) goto LAB_0012f625;
      if (pgVar41->nb[0] == 4) {
        lVar38 = pgVar41->ne[1];
        lVar48 = pgVar41->ne[2];
        sVar6 = pgVar41->nb[1];
        sVar7 = pgVar41->nb[2];
        sVar8 = pgVar41->nb[3];
        lVar9 = dst->ne[0];
        sVar10 = dst->nb[1];
        sVar11 = dst->nb[2];
        sVar12 = dst->nb[3];
        iVar3 = params->ith;
        iVar4 = params->nth;
        lVar32 = ggml_nrows();
        lVar33 = ((long)iVar4 + -1 + lVar32) / (long)iVar4;
        lVar47 = iVar3 * lVar33;
        lVar33 = lVar33 + lVar47;
        if (lVar32 <= lVar33) {
          lVar33 = lVar32;
        }
        if (lVar33 <= lVar47) {
          return;
        }
        lVar48 = lVar48 * lVar38;
        pvVar13 = dst->data;
        pvVar14 = pgVar41->data;
        do {
          lVar32 = lVar47 / lVar48;
          lVar37 = lVar47 % lVar48;
          lVar34 = lVar37 / lVar38;
          lVar37 = lVar37 % lVar38;
          if (0 < lVar9) {
            lVar35 = 0;
            do {
              fVar56 = *(float *)((long)pvVar14 +
                                 lVar35 * 4 + lVar34 * sVar7 + lVar37 * sVar6 + lVar32 * sVar8);
              *(float *)((long)pvVar13 +
                        lVar35 * 4 + lVar34 * sVar11 + lVar37 * sVar10 + lVar32 * sVar12) =
                   fVar56 * fVar56;
              lVar35 = lVar35 + 1;
            } while (lVar9 != lVar35);
          }
          lVar47 = lVar47 + 1;
        } while (lVar47 != lVar33);
        return;
      }
LAB_0012f641:
      pcVar36 = "nb00 == sizeof(src0_t)";
      uVar40 = 0x56;
      goto LAB_0012f65b;
    }
  }
  else if ((gVar2 == GGML_TYPE_F16) && (dst->type == GGML_TYPE_F16)) {
    cVar30 = ggml_is_contiguous_1(pgVar41);
    if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(dst), cVar30 != '\0')) &&
       (cVar30 = ggml_are_same_shape(pgVar41,dst), cVar30 != '\0')) {
      if (dst->nb[0] == 2) {
        if (pgVar41->nb[0] == 2) {
          lVar38 = pgVar41->ne[1];
          lVar48 = pgVar41->ne[2];
          sVar6 = pgVar41->nb[1];
          sVar7 = pgVar41->nb[2];
          sVar8 = pgVar41->nb[3];
          lVar9 = dst->ne[0];
          iVar3 = params->ith;
          iVar4 = params->nth;
          lVar32 = ggml_nrows();
          lVar33 = ((long)iVar4 + -1 + lVar32) / (long)iVar4;
          lVar47 = iVar3 * lVar33;
          lVar33 = lVar33 + lVar47;
          if (lVar32 <= lVar33) {
            lVar33 = lVar32;
          }
          if (lVar33 <= lVar47) {
            return;
          }
          lVar48 = lVar48 * lVar38;
          do {
            lVar32 = lVar47 % lVar48;
            if (0 < lVar9) {
              lVar34 = 0;
              do {
                auVar57 = vcvtps2ph_f16c(ZEXT416((uint)(*(float *)(&ggml_table_f32_f16 +
                                                                  (ulong)*(ushort *)
                                                                          ((long)pgVar41->data +
                                                                          lVar34 * 2 +
                                                                          (lVar32 / lVar38) * sVar7
                                                                          + (lVar32 % lVar38) *
                                                                            sVar6 + (lVar47 / lVar48
                                                                                    ) * sVar8) * 4)
                                                       * *(float *)(&ggml_table_f32_f16 +
                                                                   (ulong)*(ushort *)
                                                                           ((long)pgVar41->data +
                                                                           lVar34 * 2 +
                                                                           (lVar32 / lVar38) * sVar7
                                                                           + (lVar32 % lVar38) *
                                                                             sVar6 + (lVar47 / 
                                                  lVar48) * sVar8) * 4))),0);
                vpextrw_avx(auVar57,0);
                lVar34 = lVar34 + 1;
              } while (lVar9 != lVar34);
            }
            lVar47 = lVar47 + 1;
          } while (lVar47 != lVar33);
          return;
        }
        goto LAB_0012f641;
      }
      goto LAB_0012f625;
    }
  }
  else if (gVar2 == GGML_TYPE_BF16) {
    gVar5 = dst->type;
    in_RCX = (ulong)gVar5;
    if (gVar5 == GGML_TYPE_F32) {
      cVar30 = ggml_is_contiguous_1(pgVar41);
      if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(dst), cVar30 != '\0')) &&
         (cVar30 = ggml_are_same_shape(pgVar41,dst), cVar30 != '\0')) {
        if (dst->nb[0] == 4) {
          if (pgVar41->nb[0] == 2) {
            lVar38 = pgVar41->ne[1];
            lVar48 = pgVar41->ne[2];
            sVar6 = pgVar41->nb[1];
            sVar7 = pgVar41->nb[2];
            sVar8 = pgVar41->nb[3];
            lVar9 = dst->ne[0];
            sVar10 = dst->nb[1];
            sVar11 = dst->nb[2];
            sVar12 = dst->nb[3];
            iVar3 = params->ith;
            iVar4 = params->nth;
            lVar32 = ggml_nrows(pgVar41);
            lVar33 = ((long)iVar4 + -1 + lVar32) / (long)iVar4;
            lVar47 = iVar3 * lVar33;
            lVar33 = lVar33 + lVar47;
            if (lVar32 <= lVar33) {
              lVar33 = lVar32;
            }
            if (lVar33 <= lVar47) {
              return;
            }
            lVar48 = lVar48 * lVar38;
            pvVar13 = dst->data;
            pvVar14 = pgVar41->data;
            auVar55 = vpbroadcastq_avx512f();
            auVar51 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
            auVar52 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            do {
              lVar32 = lVar47 / lVar48;
              lVar37 = lVar47 % lVar48;
              lVar34 = lVar37 / lVar38;
              lVar37 = lVar37 % lVar38;
              if (0 < lVar9) {
                uVar46 = 0;
                do {
                  auVar53 = vpbroadcastq_avx512f();
                  auVar54 = vporq_avx512f(auVar53,auVar51);
                  auVar53 = vporq_avx512f(auVar53,auVar52);
                  uVar40 = vpcmpuq_avx512f(auVar53,auVar55,2);
                  bVar28 = (byte)uVar40;
                  uVar40 = vpcmpuq_avx512f(auVar54,auVar55,2);
                  bVar29 = (byte)uVar40;
                  uVar39 = CONCAT11(bVar29,bVar28);
                  auVar50 = vmovdqu16_avx512vl(*(undefined1 (*) [32])
                                                ((long)pvVar14 +
                                                uVar46 * 2 +
                                                lVar34 * sVar7 + lVar37 * sVar6 + lVar32 * sVar8));
                  auVar49._2_2_ = (ushort)((byte)(uVar39 >> 1) & 1) * auVar50._2_2_;
                  auVar49._0_2_ = (ushort)(bVar28 & 1) * auVar50._0_2_;
                  auVar49._4_2_ = (ushort)((byte)(uVar39 >> 2) & 1) * auVar50._4_2_;
                  auVar49._6_2_ = (ushort)((byte)(uVar39 >> 3) & 1) * auVar50._6_2_;
                  auVar49._8_2_ = (ushort)((byte)(uVar39 >> 4) & 1) * auVar50._8_2_;
                  auVar49._10_2_ = (ushort)((byte)(uVar39 >> 5) & 1) * auVar50._10_2_;
                  auVar49._12_2_ = (ushort)((byte)(uVar39 >> 6) & 1) * auVar50._12_2_;
                  auVar49._14_2_ = (ushort)((byte)(uVar39 >> 7) & 1) * auVar50._14_2_;
                  auVar49._16_2_ = (ushort)(bVar29 & 1) * auVar50._16_2_;
                  auVar49._18_2_ = (ushort)(bVar29 >> 1 & 1) * auVar50._18_2_;
                  auVar49._20_2_ = (ushort)(bVar29 >> 2 & 1) * auVar50._20_2_;
                  auVar49._22_2_ = (ushort)(bVar29 >> 3 & 1) * auVar50._22_2_;
                  auVar49._24_2_ = (ushort)(bVar29 >> 4 & 1) * auVar50._24_2_;
                  auVar49._26_2_ = (ushort)(bVar29 >> 5 & 1) * auVar50._26_2_;
                  auVar49._28_2_ = (ushort)(bVar29 >> 6 & 1) * auVar50._28_2_;
                  auVar49._30_2_ = (ushort)(bVar29 >> 7) * auVar50._30_2_;
                  auVar53 = vpmovzxwd_avx512f(auVar49);
                  auVar53 = vpslld_avx512f(auVar53,0x10);
                  auVar53 = vmulps_avx512f(auVar53,auVar53);
                  puVar1 = (uint *)((long)pvVar13 +
                                   uVar46 * 4 + lVar34 * sVar11 + lVar37 * sVar10 + lVar32 * sVar12)
                  ;
                  bVar15 = (bool)((byte)(uVar39 >> 1) & 1);
                  bVar16 = (bool)((byte)(uVar39 >> 2) & 1);
                  bVar17 = (bool)((byte)(uVar39 >> 3) & 1);
                  bVar18 = (bool)((byte)(uVar39 >> 4) & 1);
                  bVar19 = (bool)((byte)(uVar39 >> 5) & 1);
                  bVar20 = (bool)((byte)(uVar39 >> 6) & 1);
                  bVar21 = (bool)((byte)(uVar39 >> 7) & 1);
                  bVar22 = (bool)(bVar29 >> 1 & 1);
                  bVar23 = (bool)(bVar29 >> 2 & 1);
                  bVar24 = (bool)(bVar29 >> 3 & 1);
                  bVar25 = (bool)(bVar29 >> 4 & 1);
                  bVar26 = (bool)(bVar29 >> 5 & 1);
                  bVar27 = (bool)(bVar29 >> 6 & 1);
                  *puVar1 = (uint)(bVar28 & 1) * auVar53._0_4_ | (uint)!(bool)(bVar28 & 1) * *puVar1
                  ;
                  puVar1[1] = (uint)bVar15 * auVar53._4_4_ | (uint)!bVar15 * puVar1[1];
                  puVar1[2] = (uint)bVar16 * auVar53._8_4_ | (uint)!bVar16 * puVar1[2];
                  puVar1[3] = (uint)bVar17 * auVar53._12_4_ | (uint)!bVar17 * puVar1[3];
                  puVar1[4] = (uint)bVar18 * auVar53._16_4_ | (uint)!bVar18 * puVar1[4];
                  puVar1[5] = (uint)bVar19 * auVar53._20_4_ | (uint)!bVar19 * puVar1[5];
                  puVar1[6] = (uint)bVar20 * auVar53._24_4_ | (uint)!bVar20 * puVar1[6];
                  puVar1[7] = (uint)bVar21 * auVar53._28_4_ | (uint)!bVar21 * puVar1[7];
                  puVar1[8] = (uint)(bVar29 & 1) * auVar53._32_4_ |
                              (uint)!(bool)(bVar29 & 1) * puVar1[8];
                  puVar1[9] = (uint)bVar22 * auVar53._36_4_ | (uint)!bVar22 * puVar1[9];
                  puVar1[10] = (uint)bVar23 * auVar53._40_4_ | (uint)!bVar23 * puVar1[10];
                  puVar1[0xb] = (uint)bVar24 * auVar53._44_4_ | (uint)!bVar24 * puVar1[0xb];
                  puVar1[0xc] = (uint)bVar25 * auVar53._48_4_ | (uint)!bVar25 * puVar1[0xc];
                  puVar1[0xd] = (uint)bVar26 * auVar53._52_4_ | (uint)!bVar26 * puVar1[0xd];
                  puVar1[0xe] = (uint)bVar27 * auVar53._56_4_ | (uint)!bVar27 * puVar1[0xe];
                  puVar1[0xf] = (uint)(bVar29 >> 7) * auVar53._60_4_ |
                                (uint)!(bool)(bVar29 >> 7) * puVar1[0xf];
                  uVar46 = uVar46 + 0x10;
                } while ((lVar9 + 0xfU & 0xfffffffffffffff0) != uVar46);
              }
              lVar47 = lVar47 + 1;
            } while (lVar47 != lVar33);
            return;
          }
          goto LAB_0012f641;
        }
        goto LAB_0012f625;
      }
    }
    else {
      if (gVar5 != GGML_TYPE_BF16) goto LAB_0012f15a;
      cVar30 = ggml_is_contiguous_1(pgVar41);
      if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(dst), cVar30 != '\0')) &&
         (cVar30 = ggml_are_same_shape(pgVar41,dst), cVar30 != '\0')) {
        if (dst->nb[0] == 2) {
          if (pgVar41->nb[0] == 2) {
            lVar38 = pgVar41->ne[1];
            lVar48 = pgVar41->ne[2];
            sVar6 = pgVar41->nb[1];
            sVar7 = pgVar41->nb[2];
            sVar8 = pgVar41->nb[3];
            lVar9 = dst->ne[0];
            sVar10 = dst->nb[1];
            sVar11 = dst->nb[2];
            sVar12 = dst->nb[3];
            iVar3 = params->ith;
            iVar4 = params->nth;
            lVar32 = ggml_nrows(pgVar41);
            lVar33 = ((long)iVar4 + -1 + lVar32) / (long)iVar4;
            lVar47 = iVar3 * lVar33;
            lVar33 = lVar33 + lVar47;
            if (lVar32 <= lVar33) {
              lVar33 = lVar32;
            }
            if (lVar33 <= lVar47) {
              return;
            }
            lVar48 = lVar48 * lVar38;
            pvVar13 = dst->data;
            pvVar14 = pgVar41->data;
            do {
              lVar32 = lVar47 / lVar48;
              lVar37 = lVar47 % lVar48;
              lVar34 = lVar37 / lVar38;
              lVar37 = lVar37 % lVar38;
              if (0 < lVar9) {
                lVar35 = 0;
                do {
                  fVar56 = (float)((uint)*(ushort *)
                                          ((long)pvVar14 +
                                          lVar35 * 2 +
                                          lVar34 * sVar7 + lVar37 * sVar6 + lVar32 * sVar8) << 0x10)
                  ;
                  fVar56 = fVar56 * fVar56;
                  if ((uint)ABS(fVar56) < 0x7f800001) {
                    uVar39 = (ushort)((int)fVar56 + 0x7fff + ((uint)fVar56 >> 0x10 & 1) >> 0x10);
                  }
                  else {
                    uVar39 = (ushort)((uint)fVar56 >> 0x10) | 0x40;
                  }
                  *(ushort *)
                   ((long)pvVar13 + lVar35 * 2 + lVar34 * sVar11 + lVar37 * sVar10 + lVar32 * sVar12
                   ) = uVar39;
                  lVar35 = lVar35 + 1;
                } while (lVar9 != lVar35);
              }
              lVar47 = lVar47 + 1;
            } while (lVar47 != lVar33);
            return;
          }
          goto LAB_0012f641;
        }
        goto LAB_0012f625;
      }
    }
  }
  else {
LAB_0012f15a:
    if ((gVar2 != GGML_TYPE_F16) || (dst->type != GGML_TYPE_F32)) {
      ggml_compute_forward_sqr_cold_1();
      pgVar42 = pgVar41->src[0];
      gVar2 = pgVar42->type;
      if ((gVar2 == GGML_TYPE_F32) && (pgVar41->type == GGML_TYPE_F32)) {
        cVar30 = ggml_is_contiguous_1(pgVar42);
        if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar41), cVar30 != '\0')) &&
           (cVar30 = ggml_are_same_shape(pgVar42,pgVar41), cVar30 != '\0')) {
          if (pgVar41->nb[0] != 4) goto LAB_0012ff25;
          if (pgVar42->nb[0] == 4) {
            lVar38 = pgVar42->ne[1];
            lVar48 = pgVar42->ne[2];
            sVar6 = pgVar42->nb[1];
            sVar7 = pgVar42->nb[2];
            sVar8 = pgVar42->nb[3];
            lVar9 = pgVar41->ne[0];
            sVar10 = pgVar41->nb[1];
            sVar11 = pgVar41->nb[2];
            sVar12 = pgVar41->nb[3];
            gVar2 = dst->type;
            iVar3 = *(int *)&dst->field_0x4;
            lVar32 = ggml_nrows(pgVar42);
            lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
            lVar47 = (int)gVar2 * lVar33;
            lVar33 = lVar33 + lVar47;
            if (lVar32 <= lVar33) {
              lVar33 = lVar32;
            }
            if (lVar33 <= lVar47) {
              return;
            }
            lVar48 = lVar48 * lVar38;
            do {
              lVar32 = lVar47 / lVar48;
              lVar37 = lVar47 % lVar48;
              lVar34 = lVar37 / lVar38;
              lVar37 = lVar37 % lVar38;
              if (0 < lVar9) {
                pvVar13 = pgVar41->data;
                pvVar14 = pgVar42->data;
                lVar35 = 0;
                do {
                  fVar56 = *(float *)((long)pvVar14 +
                                     lVar35 * 4 + lVar34 * sVar7 + lVar37 * sVar6 + lVar32 * sVar8);
                  if (fVar56 < 0.0) {
                    fVar56 = sqrtf(fVar56);
                  }
                  else {
                    auVar57 = vsqrtss_avx(ZEXT416((uint)fVar56),ZEXT416((uint)fVar56));
                    fVar56 = auVar57._0_4_;
                  }
                  *(float *)((long)pvVar13 +
                            lVar35 * 4 + lVar34 * sVar11 + lVar37 * sVar10 + lVar32 * sVar12) =
                       fVar56;
                  lVar35 = lVar35 + 1;
                } while (lVar9 != lVar35);
              }
              lVar47 = lVar47 + 1;
            } while (lVar47 != lVar33);
            return;
          }
LAB_0012ff41:
          pcVar36 = "nb00 == sizeof(src0_t)";
          uVar40 = 0x56;
          goto LAB_0012ff5b;
        }
      }
      else if ((gVar2 == GGML_TYPE_F16) && (pgVar41->type == GGML_TYPE_F16)) {
        cVar30 = ggml_is_contiguous_1(pgVar42);
        if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar41), cVar30 != '\0')) &&
           (cVar30 = ggml_are_same_shape(pgVar42,pgVar41), cVar30 != '\0')) {
          if (pgVar41->nb[0] == 2) {
            if (pgVar42->nb[0] == 2) {
              lVar38 = pgVar42->ne[1];
              lVar48 = pgVar42->ne[2];
              sVar6 = pgVar42->nb[1];
              sVar7 = pgVar42->nb[2];
              sVar8 = pgVar42->nb[3];
              lVar9 = pgVar41->ne[0];
              gVar2 = dst->type;
              iVar3 = *(int *)&dst->field_0x4;
              lVar32 = ggml_nrows(pgVar42);
              lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
              lVar47 = (int)gVar2 * lVar33;
              lVar33 = lVar33 + lVar47;
              if (lVar32 <= lVar33) {
                lVar33 = lVar32;
              }
              if (lVar33 <= lVar47) {
                return;
              }
              lVar48 = lVar48 * lVar38;
              do {
                lVar32 = lVar47 % lVar48;
                if (0 < lVar9) {
                  pvVar13 = pgVar42->data;
                  lVar34 = 0;
                  do {
                    fVar56 = *(float *)(&ggml_table_f32_f16 +
                                       (ulong)*(ushort *)
                                               ((long)pvVar13 +
                                               lVar34 * 2 +
                                               (lVar32 / lVar38) * sVar7 +
                                               (lVar32 % lVar38) * sVar6 + (lVar47 / lVar48) * sVar8
                                               ) * 4);
                    if (fVar56 < 0.0) {
                      auVar54._0_4_ = sqrtf(fVar56);
                      auVar54._4_60_ = extraout_var;
                      auVar57 = auVar54._0_16_;
                    }
                    else {
                      auVar57 = vsqrtss_avx(ZEXT416((uint)fVar56),ZEXT416((uint)fVar56));
                    }
                    auVar57 = vcvtps2ph_f16c(auVar57,0);
                    vpextrw_avx(auVar57,0);
                    lVar34 = lVar34 + 1;
                  } while (lVar9 != lVar34);
                }
                lVar47 = lVar47 + 1;
              } while (lVar47 != lVar33);
              return;
            }
            goto LAB_0012ff41;
          }
          goto LAB_0012ff25;
        }
      }
      else if (gVar2 == GGML_TYPE_BF16) {
        gVar5 = pgVar41->type;
        in_RCX = (ulong)gVar5;
        if (gVar5 == GGML_TYPE_F32) {
          cVar30 = ggml_is_contiguous_1(pgVar42);
          if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar41), cVar30 != '\0')) &&
             (cVar30 = ggml_are_same_shape(pgVar42,pgVar41), cVar30 != '\0')) {
            if (pgVar41->nb[0] == 4) {
              if (pgVar42->nb[0] == 2) {
                lVar38 = pgVar42->ne[1];
                lVar48 = pgVar42->ne[2];
                sVar6 = pgVar42->nb[1];
                sVar7 = pgVar42->nb[2];
                sVar8 = pgVar42->nb[3];
                lVar9 = pgVar41->ne[0];
                sVar10 = pgVar41->nb[1];
                sVar11 = pgVar41->nb[2];
                sVar12 = pgVar41->nb[3];
                gVar2 = dst->type;
                iVar3 = *(int *)&dst->field_0x4;
                lVar32 = ggml_nrows(pgVar42);
                lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                lVar47 = (int)gVar2 * lVar33;
                lVar33 = lVar33 + lVar47;
                if (lVar32 <= lVar33) {
                  lVar33 = lVar32;
                }
                if (lVar33 <= lVar47) {
                  return;
                }
                lVar48 = lVar48 * lVar38;
                do {
                  lVar32 = lVar47 / lVar48;
                  lVar37 = lVar47 % lVar48;
                  lVar34 = lVar37 / lVar38;
                  lVar37 = lVar37 % lVar38;
                  if (0 < lVar9) {
                    pvVar13 = pgVar41->data;
                    pvVar14 = pgVar42->data;
                    lVar35 = 0;
                    do {
                      uVar39 = *(ushort *)
                                ((long)pvVar14 +
                                lVar35 * 2 + lVar34 * sVar7 + lVar37 * sVar6 + lVar32 * sVar8);
                      fVar56 = (float)((uint)uVar39 << 0x10);
                      if (fVar56 < 0.0) {
                        fVar56 = sqrtf(fVar56);
                      }
                      else {
                        auVar57 = ZEXT216(uVar39) << 0x10;
                        auVar57 = vsqrtss_avx(auVar57,auVar57);
                        fVar56 = auVar57._0_4_;
                      }
                      *(float *)((long)pvVar13 +
                                lVar35 * 4 + lVar34 * sVar11 + lVar37 * sVar10 + lVar32 * sVar12) =
                           fVar56;
                      lVar35 = lVar35 + 1;
                    } while (lVar9 != lVar35);
                  }
                  lVar47 = lVar47 + 1;
                } while (lVar47 != lVar33);
                return;
              }
              goto LAB_0012ff41;
            }
            goto LAB_0012ff25;
          }
        }
        else {
          if (gVar5 != GGML_TYPE_BF16) goto LAB_0012fa32;
          cVar30 = ggml_is_contiguous_1(pgVar42);
          if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar41), cVar30 != '\0')) &&
             (cVar30 = ggml_are_same_shape(pgVar42,pgVar41), cVar30 != '\0')) {
            if (pgVar41->nb[0] == 2) {
              if (pgVar42->nb[0] == 2) {
                lVar38 = pgVar42->ne[1];
                lVar48 = pgVar42->ne[2];
                sVar6 = pgVar42->nb[1];
                sVar7 = pgVar42->nb[2];
                sVar8 = pgVar42->nb[3];
                lVar9 = pgVar41->ne[0];
                sVar10 = pgVar41->nb[1];
                sVar11 = pgVar41->nb[2];
                sVar12 = pgVar41->nb[3];
                gVar2 = dst->type;
                iVar3 = *(int *)&dst->field_0x4;
                lVar32 = ggml_nrows(pgVar42);
                lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                lVar47 = (int)gVar2 * lVar33;
                lVar33 = lVar33 + lVar47;
                if (lVar32 <= lVar33) {
                  lVar33 = lVar32;
                }
                if (lVar33 <= lVar47) {
                  return;
                }
                lVar48 = lVar48 * lVar38;
                do {
                  lVar32 = lVar47 / lVar48;
                  lVar37 = lVar47 % lVar48;
                  lVar34 = lVar37 / lVar38;
                  lVar37 = lVar37 % lVar38;
                  if (0 < lVar9) {
                    pvVar13 = pgVar41->data;
                    pvVar14 = pgVar42->data;
                    lVar35 = 0;
                    do {
                      uVar39 = *(ushort *)
                                ((long)pvVar14 +
                                lVar35 * 2 + lVar34 * sVar7 + lVar37 * sVar6 + lVar32 * sVar8);
                      fVar56 = (float)((uint)uVar39 << 0x10);
                      if (fVar56 < 0.0) {
                        fVar56 = sqrtf(fVar56);
                      }
                      else {
                        auVar57 = ZEXT216(uVar39) << 0x10;
                        auVar57 = vsqrtss_avx(auVar57,auVar57);
                        fVar56 = auVar57._0_4_;
                      }
                      if ((uint)ABS(fVar56) < 0x7f800001) {
                        uVar39 = (ushort)((int)fVar56 + 0x7fff + ((uint)fVar56 >> 0x10 & 1) >> 0x10)
                        ;
                      }
                      else {
                        uVar39 = (ushort)((uint)fVar56 >> 0x10) | 0x40;
                      }
                      *(ushort *)
                       ((long)pvVar13 +
                       lVar35 * 2 + lVar34 * sVar11 + lVar37 * sVar10 + lVar32 * sVar12) = uVar39;
                      lVar35 = lVar35 + 1;
                    } while (lVar9 != lVar35);
                  }
                  lVar47 = lVar47 + 1;
                } while (lVar47 != lVar33);
                return;
              }
              goto LAB_0012ff41;
            }
            goto LAB_0012ff25;
          }
        }
      }
      else {
LAB_0012fa32:
        if ((gVar2 != GGML_TYPE_F16) || (pgVar41->type != GGML_TYPE_F32)) {
          ggml_compute_forward_sqrt_cold_1();
          pgVar43 = pgVar42->src[0];
          gVar2 = pgVar43->type;
          if ((gVar2 == GGML_TYPE_F32) && (pgVar42->type == GGML_TYPE_F32)) {
            cVar30 = ggml_is_contiguous_1(pgVar43);
            if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar42), cVar30 != '\0')) &&
               (cVar30 = ggml_are_same_shape(pgVar43,pgVar42), cVar30 != '\0')) {
              if (pgVar42->nb[0] != 4) goto LAB_001307b1;
              if (pgVar43->nb[0] == 4) {
                lVar38 = pgVar43->ne[1];
                lVar48 = pgVar43->ne[2];
                sVar6 = pgVar43->nb[1];
                sVar7 = pgVar43->nb[2];
                sVar8 = pgVar43->nb[3];
                lVar9 = pgVar42->ne[0];
                sVar10 = pgVar42->nb[1];
                sVar11 = pgVar42->nb[2];
                sVar12 = pgVar42->nb[3];
                gVar2 = pgVar41->type;
                iVar3 = *(int *)&pgVar41->field_0x4;
                lVar32 = ggml_nrows(pgVar43);
                lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                lVar47 = (int)gVar2 * lVar33;
                lVar33 = lVar33 + lVar47;
                if (lVar32 <= lVar33) {
                  lVar33 = lVar32;
                }
                if (lVar33 <= lVar47) {
                  return;
                }
                lVar48 = lVar48 * lVar38;
                do {
                  lVar32 = lVar47 / lVar48;
                  lVar37 = lVar47 % lVar48;
                  lVar34 = lVar37 / lVar38;
                  lVar37 = lVar37 % lVar38;
                  if (0 < lVar9) {
                    pvVar13 = pgVar42->data;
                    pvVar14 = pgVar43->data;
                    lVar35 = 0;
                    do {
                      fVar56 = sinf(*(float *)((long)pvVar14 +
                                              lVar35 * 4 +
                                              lVar34 * sVar7 + lVar37 * sVar6 + lVar32 * sVar8));
                      *(float *)((long)pvVar13 +
                                lVar35 * 4 + lVar34 * sVar11 + lVar37 * sVar10 + lVar32 * sVar12) =
                           fVar56;
                      lVar35 = lVar35 + 1;
                    } while (lVar9 != lVar35);
                  }
                  lVar47 = lVar47 + 1;
                } while (lVar47 != lVar33);
                return;
              }
LAB_001307cd:
              pcVar36 = "nb00 == sizeof(src0_t)";
              uVar40 = 0x56;
              goto LAB_001307e7;
            }
          }
          else if ((gVar2 == GGML_TYPE_F16) && (pgVar42->type == GGML_TYPE_F16)) {
            cVar30 = ggml_is_contiguous_1(pgVar43);
            if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar42), cVar30 != '\0')) &&
               (cVar30 = ggml_are_same_shape(pgVar43,pgVar42), cVar30 != '\0')) {
              if (pgVar42->nb[0] == 2) {
                if (pgVar43->nb[0] == 2) {
                  lVar38 = pgVar43->ne[1];
                  lVar48 = pgVar43->ne[2];
                  sVar6 = pgVar43->nb[1];
                  sVar7 = pgVar43->nb[2];
                  sVar8 = pgVar43->nb[3];
                  lVar9 = pgVar42->ne[0];
                  gVar2 = pgVar41->type;
                  iVar3 = *(int *)&pgVar41->field_0x4;
                  lVar32 = ggml_nrows(pgVar43);
                  lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                  lVar47 = (int)gVar2 * lVar33;
                  lVar33 = lVar33 + lVar47;
                  if (lVar32 <= lVar33) {
                    lVar33 = lVar32;
                  }
                  if (lVar33 <= lVar47) {
                    return;
                  }
                  lVar48 = lVar48 * lVar38;
                  do {
                    lVar32 = lVar47 % lVar48;
                    if (0 < lVar9) {
                      pvVar13 = pgVar43->data;
                      lVar34 = 0;
                      do {
                        auVar53._0_4_ =
                             sinf(*(float *)(&ggml_table_f32_f16 +
                                            (ulong)*(ushort *)
                                                    ((long)pvVar13 +
                                                    lVar34 * 2 +
                                                    (lVar32 / lVar38) * sVar7 +
                                                    (lVar32 % lVar38) * sVar6 +
                                                    (lVar47 / lVar48) * sVar8) * 4));
                        auVar53._4_60_ = extraout_var_00;
                        auVar57 = vcvtps2ph_f16c(auVar53._0_16_,0);
                        vpextrw_avx(auVar57,0);
                        lVar34 = lVar34 + 1;
                      } while (lVar9 != lVar34);
                    }
                    lVar47 = lVar47 + 1;
                  } while (lVar47 != lVar33);
                  return;
                }
                goto LAB_001307cd;
              }
              goto LAB_001307b1;
            }
          }
          else if (gVar2 == GGML_TYPE_BF16) {
            gVar5 = pgVar42->type;
            in_RCX = (ulong)gVar5;
            if (gVar5 == GGML_TYPE_F32) {
              cVar30 = ggml_is_contiguous_1(pgVar43);
              if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar42), cVar30 != '\0')) &&
                 (cVar30 = ggml_are_same_shape(pgVar43,pgVar42), cVar30 != '\0')) {
                if (pgVar42->nb[0] == 4) {
                  if (pgVar43->nb[0] == 2) {
                    lVar38 = pgVar43->ne[1];
                    lVar48 = pgVar43->ne[2];
                    sVar6 = pgVar43->nb[1];
                    sVar7 = pgVar43->nb[2];
                    sVar8 = pgVar43->nb[3];
                    lVar9 = pgVar42->ne[0];
                    sVar10 = pgVar42->nb[1];
                    sVar11 = pgVar42->nb[2];
                    sVar12 = pgVar42->nb[3];
                    gVar2 = pgVar41->type;
                    iVar3 = *(int *)&pgVar41->field_0x4;
                    lVar32 = ggml_nrows(pgVar43);
                    lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                    lVar47 = (int)gVar2 * lVar33;
                    lVar33 = lVar33 + lVar47;
                    if (lVar32 <= lVar33) {
                      lVar33 = lVar32;
                    }
                    if (lVar33 <= lVar47) {
                      return;
                    }
                    lVar48 = lVar48 * lVar38;
                    do {
                      lVar32 = lVar47 / lVar48;
                      lVar37 = lVar47 % lVar48;
                      lVar34 = lVar37 / lVar38;
                      lVar37 = lVar37 % lVar38;
                      if (0 < lVar9) {
                        pvVar13 = pgVar42->data;
                        pvVar14 = pgVar43->data;
                        lVar35 = 0;
                        do {
                          fVar56 = sinf((float)((uint)*(ushort *)
                                                       ((long)pvVar14 +
                                                       lVar35 * 2 +
                                                       lVar34 * sVar7 +
                                                       lVar37 * sVar6 + lVar32 * sVar8) << 0x10));
                          *(float *)((long)pvVar13 +
                                    lVar35 * 4 + lVar34 * sVar11 + lVar37 * sVar10 + lVar32 * sVar12
                                    ) = fVar56;
                          lVar35 = lVar35 + 1;
                        } while (lVar9 != lVar35);
                      }
                      lVar47 = lVar47 + 1;
                    } while (lVar47 != lVar33);
                    return;
                  }
                  goto LAB_001307cd;
                }
                goto LAB_001307b1;
              }
            }
            else {
              if (gVar5 != GGML_TYPE_BF16) goto LAB_00130306;
              cVar30 = ggml_is_contiguous_1(pgVar43);
              if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar42), cVar30 != '\0')) &&
                 (cVar30 = ggml_are_same_shape(pgVar43,pgVar42), cVar30 != '\0')) {
                if (pgVar42->nb[0] == 2) {
                  if (pgVar43->nb[0] == 2) {
                    lVar38 = pgVar43->ne[1];
                    lVar48 = pgVar43->ne[2];
                    sVar6 = pgVar43->nb[1];
                    sVar7 = pgVar43->nb[2];
                    sVar8 = pgVar43->nb[3];
                    lVar9 = pgVar42->ne[0];
                    sVar10 = pgVar42->nb[1];
                    sVar11 = pgVar42->nb[2];
                    sVar12 = pgVar42->nb[3];
                    gVar2 = pgVar41->type;
                    iVar3 = *(int *)&pgVar41->field_0x4;
                    lVar32 = ggml_nrows(pgVar43);
                    lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                    lVar47 = (int)gVar2 * lVar33;
                    lVar33 = lVar33 + lVar47;
                    if (lVar32 <= lVar33) {
                      lVar33 = lVar32;
                    }
                    if (lVar33 <= lVar47) {
                      return;
                    }
                    lVar48 = lVar48 * lVar38;
                    do {
                      lVar32 = lVar47 / lVar48;
                      lVar37 = lVar47 % lVar48;
                      lVar34 = lVar37 / lVar38;
                      lVar37 = lVar37 % lVar38;
                      if (0 < lVar9) {
                        pvVar13 = pgVar42->data;
                        pvVar14 = pgVar43->data;
                        lVar35 = 0;
                        do {
                          fVar56 = sinf((float)((uint)*(ushort *)
                                                       ((long)pvVar14 +
                                                       lVar35 * 2 +
                                                       lVar34 * sVar7 +
                                                       lVar37 * sVar6 + lVar32 * sVar8) << 0x10));
                          if ((uint)ABS(fVar56) < 0x7f800001) {
                            uVar39 = (ushort)((int)fVar56 + 0x7fff + ((uint)fVar56 >> 0x10 & 1) >>
                                             0x10);
                          }
                          else {
                            uVar39 = (ushort)((uint)fVar56 >> 0x10) | 0x40;
                          }
                          *(ushort *)
                           ((long)pvVar13 +
                           lVar35 * 2 + lVar34 * sVar11 + lVar37 * sVar10 + lVar32 * sVar12) =
                               uVar39;
                          lVar35 = lVar35 + 1;
                        } while (lVar9 != lVar35);
                      }
                      lVar47 = lVar47 + 1;
                    } while (lVar47 != lVar33);
                    return;
                  }
                  goto LAB_001307cd;
                }
                goto LAB_001307b1;
              }
            }
          }
          else {
LAB_00130306:
            if ((gVar2 != GGML_TYPE_F16) || (pgVar42->type != GGML_TYPE_F32)) {
              ggml_compute_forward_sin_cold_1();
              pgVar41 = pgVar43->src[0];
              gVar2 = pgVar41->type;
              if ((gVar2 == GGML_TYPE_F32) && (pgVar43->type == GGML_TYPE_F32)) {
                cVar30 = ggml_is_contiguous_1(pgVar41);
                if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar43), cVar30 != '\0'))
                   && (cVar30 = ggml_are_same_shape(pgVar41,pgVar43), cVar30 != '\0')) {
                  if (pgVar43->nb[0] != 4) goto LAB_0013103d;
                  if (pgVar41->nb[0] == 4) {
                    lVar38 = pgVar41->ne[1];
                    lVar48 = pgVar41->ne[2];
                    sVar6 = pgVar41->nb[1];
                    sVar7 = pgVar41->nb[2];
                    sVar8 = pgVar41->nb[3];
                    lVar9 = pgVar43->ne[0];
                    sVar10 = pgVar43->nb[1];
                    sVar11 = pgVar43->nb[2];
                    sVar12 = pgVar43->nb[3];
                    gVar2 = pgVar42->type;
                    iVar3 = *(int *)&pgVar42->field_0x4;
                    lVar32 = ggml_nrows(pgVar41);
                    lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                    lVar47 = (int)gVar2 * lVar33;
                    lVar33 = lVar33 + lVar47;
                    if (lVar32 <= lVar33) {
                      lVar33 = lVar32;
                    }
                    if (lVar33 <= lVar47) {
                      return;
                    }
                    lVar48 = lVar48 * lVar38;
                    do {
                      lVar32 = lVar47 / lVar48;
                      lVar37 = lVar47 % lVar48;
                      lVar34 = lVar37 / lVar38;
                      lVar37 = lVar37 % lVar38;
                      if (0 < lVar9) {
                        pvVar13 = pgVar43->data;
                        pvVar14 = pgVar41->data;
                        lVar35 = 0;
                        do {
                          fVar56 = cosf(*(float *)((long)pvVar14 +
                                                  lVar35 * 4 +
                                                  lVar34 * sVar7 + lVar37 * sVar6 + lVar32 * sVar8))
                          ;
                          *(float *)((long)pvVar13 +
                                    lVar35 * 4 + lVar34 * sVar11 + lVar37 * sVar10 + lVar32 * sVar12
                                    ) = fVar56;
                          lVar35 = lVar35 + 1;
                        } while (lVar9 != lVar35);
                      }
                      lVar47 = lVar47 + 1;
                    } while (lVar47 != lVar33);
                    return;
                  }
LAB_00131059:
                  pcVar36 = "nb00 == sizeof(src0_t)";
                  uVar40 = 0x56;
                  goto LAB_00131073;
                }
              }
              else if ((gVar2 == GGML_TYPE_F16) && (pgVar43->type == GGML_TYPE_F16)) {
                cVar30 = ggml_is_contiguous_1(pgVar41);
                if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar43), cVar30 != '\0'))
                   && (cVar30 = ggml_are_same_shape(pgVar41,pgVar43), cVar30 != '\0')) {
                  if (pgVar43->nb[0] == 2) {
                    if (pgVar41->nb[0] == 2) {
                      lVar38 = pgVar41->ne[1];
                      lVar48 = pgVar41->ne[2];
                      sVar6 = pgVar41->nb[1];
                      sVar7 = pgVar41->nb[2];
                      sVar8 = pgVar41->nb[3];
                      lVar9 = pgVar43->ne[0];
                      gVar2 = pgVar42->type;
                      iVar3 = *(int *)&pgVar42->field_0x4;
                      lVar32 = ggml_nrows(pgVar41);
                      lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                      lVar47 = (int)gVar2 * lVar33;
                      lVar33 = lVar33 + lVar47;
                      if (lVar32 <= lVar33) {
                        lVar33 = lVar32;
                      }
                      if (lVar33 <= lVar47) {
                        return;
                      }
                      lVar48 = lVar48 * lVar38;
                      do {
                        lVar32 = lVar47 % lVar48;
                        if (0 < lVar9) {
                          pvVar13 = pgVar41->data;
                          lVar34 = 0;
                          do {
                            auVar52._0_4_ =
                                 cosf(*(float *)(&ggml_table_f32_f16 +
                                                (ulong)*(ushort *)
                                                        ((long)pvVar13 +
                                                        lVar34 * 2 +
                                                        (lVar32 / lVar38) * sVar7 +
                                                        (lVar32 % lVar38) * sVar6 +
                                                        (lVar47 / lVar48) * sVar8) * 4));
                            auVar52._4_60_ = extraout_var_01;
                            auVar57 = vcvtps2ph_f16c(auVar52._0_16_,0);
                            vpextrw_avx(auVar57,0);
                            lVar34 = lVar34 + 1;
                          } while (lVar9 != lVar34);
                        }
                        lVar47 = lVar47 + 1;
                      } while (lVar47 != lVar33);
                      return;
                    }
                    goto LAB_00131059;
                  }
                  goto LAB_0013103d;
                }
              }
              else if (gVar2 == GGML_TYPE_BF16) {
                gVar5 = pgVar43->type;
                in_RCX = (ulong)gVar5;
                if (gVar5 == GGML_TYPE_F32) {
                  cVar30 = ggml_is_contiguous_1(pgVar41);
                  if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar43), cVar30 != '\0'))
                     && (cVar30 = ggml_are_same_shape(pgVar41,pgVar43), cVar30 != '\0')) {
                    if (pgVar43->nb[0] == 4) {
                      if (pgVar41->nb[0] == 2) {
                        lVar38 = pgVar41->ne[1];
                        lVar48 = pgVar41->ne[2];
                        sVar6 = pgVar41->nb[1];
                        sVar7 = pgVar41->nb[2];
                        sVar8 = pgVar41->nb[3];
                        lVar9 = pgVar43->ne[0];
                        sVar10 = pgVar43->nb[1];
                        sVar11 = pgVar43->nb[2];
                        sVar12 = pgVar43->nb[3];
                        gVar2 = pgVar42->type;
                        iVar3 = *(int *)&pgVar42->field_0x4;
                        lVar32 = ggml_nrows(pgVar41);
                        lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                        lVar47 = (int)gVar2 * lVar33;
                        lVar33 = lVar33 + lVar47;
                        if (lVar32 <= lVar33) {
                          lVar33 = lVar32;
                        }
                        if (lVar33 <= lVar47) {
                          return;
                        }
                        lVar48 = lVar48 * lVar38;
                        do {
                          lVar32 = lVar47 / lVar48;
                          lVar37 = lVar47 % lVar48;
                          lVar34 = lVar37 / lVar38;
                          lVar37 = lVar37 % lVar38;
                          if (0 < lVar9) {
                            pvVar13 = pgVar43->data;
                            pvVar14 = pgVar41->data;
                            lVar35 = 0;
                            do {
                              fVar56 = cosf((float)((uint)*(ushort *)
                                                           ((long)pvVar14 +
                                                           lVar35 * 2 +
                                                           lVar34 * sVar7 +
                                                           lVar37 * sVar6 + lVar32 * sVar8) << 0x10)
                                           );
                              *(float *)((long)pvVar13 +
                                        lVar35 * 4 +
                                        lVar34 * sVar11 + lVar37 * sVar10 + lVar32 * sVar12) =
                                   fVar56;
                              lVar35 = lVar35 + 1;
                            } while (lVar9 != lVar35);
                          }
                          lVar47 = lVar47 + 1;
                        } while (lVar47 != lVar33);
                        return;
                      }
                      goto LAB_00131059;
                    }
                    goto LAB_0013103d;
                  }
                }
                else {
                  if (gVar5 != GGML_TYPE_BF16) goto LAB_00130b92;
                  cVar30 = ggml_is_contiguous_1(pgVar41);
                  if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar43), cVar30 != '\0'))
                     && (cVar30 = ggml_are_same_shape(pgVar41,pgVar43), cVar30 != '\0')) {
                    if (pgVar43->nb[0] == 2) {
                      if (pgVar41->nb[0] == 2) {
                        lVar38 = pgVar41->ne[1];
                        lVar48 = pgVar41->ne[2];
                        sVar6 = pgVar41->nb[1];
                        sVar7 = pgVar41->nb[2];
                        sVar8 = pgVar41->nb[3];
                        lVar9 = pgVar43->ne[0];
                        sVar10 = pgVar43->nb[1];
                        sVar11 = pgVar43->nb[2];
                        sVar12 = pgVar43->nb[3];
                        gVar2 = pgVar42->type;
                        iVar3 = *(int *)&pgVar42->field_0x4;
                        lVar32 = ggml_nrows(pgVar41);
                        lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                        lVar47 = (int)gVar2 * lVar33;
                        lVar33 = lVar33 + lVar47;
                        if (lVar32 <= lVar33) {
                          lVar33 = lVar32;
                        }
                        if (lVar33 <= lVar47) {
                          return;
                        }
                        lVar48 = lVar48 * lVar38;
                        do {
                          lVar32 = lVar47 / lVar48;
                          lVar37 = lVar47 % lVar48;
                          lVar34 = lVar37 / lVar38;
                          lVar37 = lVar37 % lVar38;
                          if (0 < lVar9) {
                            pvVar13 = pgVar43->data;
                            pvVar14 = pgVar41->data;
                            lVar35 = 0;
                            do {
                              fVar56 = cosf((float)((uint)*(ushort *)
                                                           ((long)pvVar14 +
                                                           lVar35 * 2 +
                                                           lVar34 * sVar7 +
                                                           lVar37 * sVar6 + lVar32 * sVar8) << 0x10)
                                           );
                              if ((uint)ABS(fVar56) < 0x7f800001) {
                                uVar39 = (ushort)((int)fVar56 + 0x7fff + ((uint)fVar56 >> 0x10 & 1)
                                                 >> 0x10);
                              }
                              else {
                                uVar39 = (ushort)((uint)fVar56 >> 0x10) | 0x40;
                              }
                              *(ushort *)
                               ((long)pvVar13 +
                               lVar35 * 2 + lVar34 * sVar11 + lVar37 * sVar10 + lVar32 * sVar12) =
                                   uVar39;
                              lVar35 = lVar35 + 1;
                            } while (lVar9 != lVar35);
                          }
                          lVar47 = lVar47 + 1;
                        } while (lVar47 != lVar33);
                        return;
                      }
                      goto LAB_00131059;
                    }
                    goto LAB_0013103d;
                  }
                }
              }
              else {
LAB_00130b92:
                if ((gVar2 != GGML_TYPE_F16) || (pgVar43->type != GGML_TYPE_F32)) {
                  ggml_compute_forward_cos_cold_1();
                  pgVar42 = pgVar41->src[0];
                  gVar2 = pgVar42->type;
                  if ((gVar2 == GGML_TYPE_F32) && (pgVar41->type == GGML_TYPE_F32)) {
                    cVar30 = ggml_is_contiguous_1(pgVar42);
                    if (((cVar30 != '\0') &&
                        (cVar30 = ggml_is_contiguous_1(pgVar41), cVar30 != '\0')) &&
                       (cVar30 = ggml_are_same_shape(pgVar42,pgVar41), cVar30 != '\0')) {
                      if (pgVar41->nb[0] != 4) goto LAB_001318c9;
                      if (pgVar42->nb[0] == 4) {
                        lVar38 = pgVar42->ne[1];
                        lVar48 = pgVar42->ne[2];
                        sVar6 = pgVar42->nb[1];
                        sVar7 = pgVar42->nb[2];
                        sVar8 = pgVar42->nb[3];
                        lVar9 = pgVar41->ne[0];
                        sVar10 = pgVar41->nb[1];
                        sVar11 = pgVar41->nb[2];
                        sVar12 = pgVar41->nb[3];
                        gVar2 = pgVar43->type;
                        iVar3 = *(int *)&pgVar43->field_0x4;
                        lVar32 = ggml_nrows(pgVar42);
                        lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                        lVar47 = (int)gVar2 * lVar33;
                        lVar33 = lVar33 + lVar47;
                        if (lVar32 <= lVar33) {
                          lVar33 = lVar32;
                        }
                        if (lVar33 <= lVar47) {
                          return;
                        }
                        lVar48 = lVar48 * lVar38;
                        do {
                          lVar32 = lVar47 / lVar48;
                          lVar37 = lVar47 % lVar48;
                          lVar34 = lVar37 / lVar38;
                          lVar37 = lVar37 % lVar38;
                          if (0 < lVar9) {
                            pvVar13 = pgVar41->data;
                            pvVar14 = pgVar42->data;
                            lVar35 = 0;
                            do {
                              fVar56 = logf(*(float *)((long)pvVar14 +
                                                      lVar35 * 4 +
                                                      lVar34 * sVar7 +
                                                      lVar37 * sVar6 + lVar32 * sVar8));
                              *(float *)((long)pvVar13 +
                                        lVar35 * 4 +
                                        lVar34 * sVar11 + lVar37 * sVar10 + lVar32 * sVar12) =
                                   fVar56;
                              lVar35 = lVar35 + 1;
                            } while (lVar9 != lVar35);
                          }
                          lVar47 = lVar47 + 1;
                        } while (lVar47 != lVar33);
                        return;
                      }
LAB_001318e5:
                      pcVar36 = "nb00 == sizeof(src0_t)";
                      uVar40 = 0x56;
                      goto LAB_001318ff;
                    }
                  }
                  else if ((gVar2 == GGML_TYPE_F16) && (pgVar41->type == GGML_TYPE_F16)) {
                    cVar30 = ggml_is_contiguous_1(pgVar42);
                    if (((cVar30 != '\0') &&
                        (cVar30 = ggml_is_contiguous_1(pgVar41), cVar30 != '\0')) &&
                       (cVar30 = ggml_are_same_shape(pgVar42,pgVar41), cVar30 != '\0')) {
                      if (pgVar41->nb[0] == 2) {
                        if (pgVar42->nb[0] == 2) {
                          lVar38 = pgVar42->ne[1];
                          lVar48 = pgVar42->ne[2];
                          sVar6 = pgVar42->nb[1];
                          sVar7 = pgVar42->nb[2];
                          sVar8 = pgVar42->nb[3];
                          lVar9 = pgVar41->ne[0];
                          gVar2 = pgVar43->type;
                          iVar3 = *(int *)&pgVar43->field_0x4;
                          lVar32 = ggml_nrows(pgVar42);
                          lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                          lVar47 = (int)gVar2 * lVar33;
                          lVar33 = lVar33 + lVar47;
                          if (lVar32 <= lVar33) {
                            lVar33 = lVar32;
                          }
                          if (lVar33 <= lVar47) {
                            return;
                          }
                          lVar48 = lVar48 * lVar38;
                          do {
                            lVar32 = lVar47 % lVar48;
                            if (0 < lVar9) {
                              pvVar13 = pgVar42->data;
                              lVar34 = 0;
                              do {
                                auVar51._0_4_ =
                                     logf(*(float *)(&ggml_table_f32_f16 +
                                                    (ulong)*(ushort *)
                                                            ((long)pvVar13 +
                                                            lVar34 * 2 +
                                                            (lVar32 / lVar38) * sVar7 +
                                                            (lVar32 % lVar38) * sVar6 +
                                                            (lVar47 / lVar48) * sVar8) * 4));
                                auVar51._4_60_ = extraout_var_02;
                                auVar57 = vcvtps2ph_f16c(auVar51._0_16_,0);
                                vpextrw_avx(auVar57,0);
                                lVar34 = lVar34 + 1;
                              } while (lVar9 != lVar34);
                            }
                            lVar47 = lVar47 + 1;
                          } while (lVar47 != lVar33);
                          return;
                        }
                        goto LAB_001318e5;
                      }
                      goto LAB_001318c9;
                    }
                  }
                  else if (gVar2 == GGML_TYPE_BF16) {
                    gVar5 = pgVar41->type;
                    in_RCX = (ulong)gVar5;
                    if (gVar5 == GGML_TYPE_F32) {
                      cVar30 = ggml_is_contiguous_1(pgVar42);
                      if (((cVar30 != '\0') &&
                          (cVar30 = ggml_is_contiguous_1(pgVar41), cVar30 != '\0')) &&
                         (cVar30 = ggml_are_same_shape(pgVar42,pgVar41), cVar30 != '\0')) {
                        if (pgVar41->nb[0] == 4) {
                          if (pgVar42->nb[0] == 2) {
                            lVar38 = pgVar42->ne[1];
                            lVar48 = pgVar42->ne[2];
                            sVar6 = pgVar42->nb[1];
                            sVar7 = pgVar42->nb[2];
                            sVar8 = pgVar42->nb[3];
                            lVar9 = pgVar41->ne[0];
                            sVar10 = pgVar41->nb[1];
                            sVar11 = pgVar41->nb[2];
                            sVar12 = pgVar41->nb[3];
                            gVar2 = pgVar43->type;
                            iVar3 = *(int *)&pgVar43->field_0x4;
                            lVar32 = ggml_nrows(pgVar42);
                            lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                            lVar47 = (int)gVar2 * lVar33;
                            lVar33 = lVar33 + lVar47;
                            if (lVar32 <= lVar33) {
                              lVar33 = lVar32;
                            }
                            if (lVar33 <= lVar47) {
                              return;
                            }
                            lVar48 = lVar48 * lVar38;
                            do {
                              lVar32 = lVar47 / lVar48;
                              lVar37 = lVar47 % lVar48;
                              lVar34 = lVar37 / lVar38;
                              lVar37 = lVar37 % lVar38;
                              if (0 < lVar9) {
                                pvVar13 = pgVar41->data;
                                pvVar14 = pgVar42->data;
                                lVar35 = 0;
                                do {
                                  fVar56 = logf((float)((uint)*(ushort *)
                                                               ((long)pvVar14 +
                                                               lVar35 * 2 +
                                                               lVar34 * sVar7 +
                                                               lVar37 * sVar6 + lVar32 * sVar8) <<
                                                       0x10));
                                  *(float *)((long)pvVar13 +
                                            lVar35 * 4 +
                                            lVar34 * sVar11 + lVar37 * sVar10 + lVar32 * sVar12) =
                                       fVar56;
                                  lVar35 = lVar35 + 1;
                                } while (lVar9 != lVar35);
                              }
                              lVar47 = lVar47 + 1;
                            } while (lVar47 != lVar33);
                            return;
                          }
                          goto LAB_001318e5;
                        }
                        goto LAB_001318c9;
                      }
                    }
                    else {
                      if (gVar5 != GGML_TYPE_BF16) goto LAB_0013141e;
                      cVar30 = ggml_is_contiguous_1(pgVar42);
                      if (((cVar30 != '\0') &&
                          (cVar30 = ggml_is_contiguous_1(pgVar41), cVar30 != '\0')) &&
                         (cVar30 = ggml_are_same_shape(pgVar42,pgVar41), cVar30 != '\0')) {
                        if (pgVar41->nb[0] == 2) {
                          if (pgVar42->nb[0] == 2) {
                            lVar38 = pgVar42->ne[1];
                            lVar48 = pgVar42->ne[2];
                            sVar6 = pgVar42->nb[1];
                            sVar7 = pgVar42->nb[2];
                            sVar8 = pgVar42->nb[3];
                            lVar9 = pgVar41->ne[0];
                            sVar10 = pgVar41->nb[1];
                            sVar11 = pgVar41->nb[2];
                            sVar12 = pgVar41->nb[3];
                            gVar2 = pgVar43->type;
                            iVar3 = *(int *)&pgVar43->field_0x4;
                            lVar32 = ggml_nrows(pgVar42);
                            lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                            lVar47 = (int)gVar2 * lVar33;
                            lVar33 = lVar33 + lVar47;
                            if (lVar32 <= lVar33) {
                              lVar33 = lVar32;
                            }
                            if (lVar33 <= lVar47) {
                              return;
                            }
                            lVar48 = lVar48 * lVar38;
                            do {
                              lVar32 = lVar47 / lVar48;
                              lVar37 = lVar47 % lVar48;
                              lVar34 = lVar37 / lVar38;
                              lVar37 = lVar37 % lVar38;
                              if (0 < lVar9) {
                                pvVar13 = pgVar41->data;
                                pvVar14 = pgVar42->data;
                                lVar35 = 0;
                                do {
                                  fVar56 = logf((float)((uint)*(ushort *)
                                                               ((long)pvVar14 +
                                                               lVar35 * 2 +
                                                               lVar34 * sVar7 +
                                                               lVar37 * sVar6 + lVar32 * sVar8) <<
                                                       0x10));
                                  if ((uint)ABS(fVar56) < 0x7f800001) {
                                    uVar39 = (ushort)((int)fVar56 + 0x7fff +
                                                      ((uint)fVar56 >> 0x10 & 1) >> 0x10);
                                  }
                                  else {
                                    uVar39 = (ushort)((uint)fVar56 >> 0x10) | 0x40;
                                  }
                                  *(ushort *)
                                   ((long)pvVar13 +
                                   lVar35 * 2 + lVar34 * sVar11 + lVar37 * sVar10 + lVar32 * sVar12)
                                       = uVar39;
                                  lVar35 = lVar35 + 1;
                                } while (lVar9 != lVar35);
                              }
                              lVar47 = lVar47 + 1;
                            } while (lVar47 != lVar33);
                            return;
                          }
                          goto LAB_001318e5;
                        }
                        goto LAB_001318c9;
                      }
                    }
                  }
                  else {
LAB_0013141e:
                    if ((gVar2 != GGML_TYPE_F16) || (pgVar41->type != GGML_TYPE_F32)) {
                      pgVar43 = pgVar41;
                      ggml_compute_forward_log_cold_1();
                      pgStack_2a0 = pgVar41;
                      uVar44 = (uint)pgVar43;
                      uVar31 = uVar44 & 0xffffffc0;
                      uStack_340 = 0;
                      uStack_338 = 0;
                      uStack_330 = 0;
                      uStack_328 = 0;
                      uStack_320 = 0;
                      uStack_318 = 0;
                      uStack_310 = 0;
                      uStack_308 = 0;
                      uStack_380 = 0;
                      uStack_378 = 0;
                      uStack_370 = 0;
                      uStack_368 = 0;
                      uStack_360 = 0;
                      uStack_358 = 0;
                      uStack_350 = 0;
                      uStack_348 = 0;
                      uStack_3c0 = 0;
                      uStack_3b8 = 0;
                      uStack_3b0 = 0;
                      uStack_3a8 = 0;
                      uStack_3a0 = 0;
                      uStack_398 = 0;
                      uStack_390 = 0;
                      uStack_388 = 0;
                      auStack_400 = ZEXT1664(ZEXT816(0));
                      if (0 < (int)uVar31) {
                        uVar45 = 0;
                        lVar38 = in_R9;
                        uVar46 = in_RCX;
                        do {
                          lVar48 = 0;
                          do {
                            auVar55 = vfmadd213ps_avx512f(*(undefined1 (*) [64])(lVar38 + lVar48),
                                                          *(undefined1 (*) [64])(uVar46 + lVar48),
                                                          *(undefined1 (*) [64])
                                                           (auStack_400 + lVar48));
                            *(undefined1 (*) [64])(auStack_400 + lVar48) = auVar55;
                            lVar48 = lVar48 + 0x40;
                          } while (lVar48 != 0x100);
                          uVar45 = uVar45 + 0x40;
                          lVar38 = lVar38 + 0x100;
                          uVar46 = uVar46 + 0x100;
                        } while (uVar45 < uVar31);
                      }
                      lVar38 = 0;
                      do {
                        auVar55 = vaddps_avx512f(*(undefined1 (*) [64])(auStack_400 + lVar38),
                                                 *(undefined1 (*) [64])((long)&uStack_380 + lVar38))
                        ;
                        *(undefined1 (*) [64])(auStack_400 + lVar38) = auVar55;
                        lVar38 = lVar38 + 0x40;
                      } while (lVar38 == 0x40);
                      auVar55._8_8_ = uStack_3b8;
                      auVar55._0_8_ = uStack_3c0;
                      auVar55._16_8_ = uStack_3b0;
                      auVar55._24_8_ = uStack_3a8;
                      auVar55._32_8_ = uStack_3a0;
                      auVar55._40_8_ = uStack_398;
                      auVar55._48_8_ = uStack_390;
                      auVar55._56_8_ = uStack_388;
                      auVar55 = vaddps_avx512f(auStack_400,auVar55);
                      auVar50 = vextractf64x4_avx512f(auVar55,1);
                      auVar55 = vaddps_avx512f(auVar55,ZEXT3264(auVar50));
                      auVar58._0_4_ = auVar55._0_4_ + auVar55._16_4_;
                      auVar58._4_4_ = auVar55._4_4_ + auVar55._20_4_;
                      auVar58._8_4_ = auVar55._8_4_ + auVar55._24_4_;
                      auVar58._12_4_ = auVar55._12_4_ + auVar55._28_4_;
                      auVar57 = vshufpd_avx(auVar58,auVar58,1);
                      auVar59._0_4_ = auVar58._0_4_ + auVar57._0_4_;
                      auVar59._4_4_ = auVar58._4_4_ + auVar57._4_4_;
                      auVar59._8_4_ = auVar58._8_4_ + auVar57._8_4_;
                      auVar59._12_4_ = auVar58._12_4_ + auVar57._12_4_;
                      auVar57 = vhaddps_avx(auVar59,auVar59);
                      auVar55 = ZEXT1664(auVar57);
                      if (uVar31 != uVar44) {
                        lVar38 = (long)(int)uVar31;
                        do {
                          auVar57 = vfmadd231ss_fma(auVar55._0_16_,
                                                    ZEXT416(*(uint *)(in_RCX + lVar38 * 4)),
                                                    ZEXT416(*(uint *)(in_R9 + lVar38 * 4)));
                          auVar55 = ZEXT1664(auVar57);
                          lVar38 = lVar38 + 1;
                        } while (lVar38 < (int)uVar44);
                      }
                      pgVar42->type = auVar55._0_4_;
                      return;
                    }
                    cVar30 = ggml_is_contiguous_1(pgVar42);
                    if (((cVar30 != '\0') &&
                        (cVar30 = ggml_is_contiguous_1(pgVar41), cVar30 != '\0')) &&
                       (cVar30 = ggml_are_same_shape(pgVar42,pgVar41), cVar30 != '\0')) {
                      if (pgVar41->nb[0] == 4) {
                        if (pgVar42->nb[0] == 2) {
                          lVar38 = pgVar42->ne[1];
                          lVar48 = pgVar42->ne[2];
                          sVar6 = pgVar42->nb[1];
                          sVar7 = pgVar42->nb[2];
                          sVar8 = pgVar42->nb[3];
                          lVar9 = pgVar41->ne[0];
                          sVar10 = pgVar41->nb[1];
                          sVar11 = pgVar41->nb[2];
                          sVar12 = pgVar41->nb[3];
                          gVar2 = pgVar43->type;
                          iVar3 = *(int *)&pgVar43->field_0x4;
                          lVar32 = ggml_nrows(pgVar42);
                          lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                          lVar47 = (int)gVar2 * lVar33;
                          lVar33 = lVar33 + lVar47;
                          if (lVar32 <= lVar33) {
                            lVar33 = lVar32;
                          }
                          if (lVar47 < lVar33) {
                            lVar48 = lVar48 * lVar38;
                            do {
                              lVar32 = lVar47 / lVar48;
                              lVar37 = lVar47 % lVar48;
                              lVar34 = lVar37 / lVar38;
                              lVar37 = lVar37 % lVar38;
                              if (0 < lVar9) {
                                pvVar13 = pgVar41->data;
                                pvVar14 = pgVar42->data;
                                lVar35 = 0;
                                do {
                                  fVar56 = logf(*(float *)(&ggml_table_f32_f16 +
                                                          (ulong)*(ushort *)
                                                                  ((long)pvVar14 +
                                                                  lVar35 * 2 +
                                                                  lVar34 * sVar7 +
                                                                  lVar37 * sVar6 + lVar32 * sVar8) *
                                                          4));
                                  *(float *)((long)pvVar13 +
                                            lVar35 * 4 +
                                            lVar34 * sVar11 + lVar37 * sVar10 + lVar32 * sVar12) =
                                       fVar56;
                                  lVar35 = lVar35 + 1;
                                } while (lVar9 != lVar35);
                              }
                              lVar47 = lVar47 + 1;
                            } while (lVar47 != lVar33);
                          }
                          return;
                        }
                        goto LAB_001318e5;
                      }
LAB_001318c9:
                      pcVar36 = "nb0 == sizeof(dst_t)";
                      uVar40 = 0x55;
                      goto LAB_001318ff;
                    }
                  }
                  pcVar36 = 
                  "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
                  ;
                  uVar40 = 0x51;
LAB_001318ff:
                  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/unary-ops.cpp"
                             ,uVar40,"GGML_ASSERT(%s) failed",pcVar36);
                }
                cVar30 = ggml_is_contiguous_1(pgVar41);
                if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar43), cVar30 != '\0'))
                   && (cVar30 = ggml_are_same_shape(pgVar41,pgVar43), cVar30 != '\0')) {
                  if (pgVar43->nb[0] == 4) {
                    if (pgVar41->nb[0] == 2) {
                      lVar38 = pgVar41->ne[1];
                      lVar48 = pgVar41->ne[2];
                      sVar6 = pgVar41->nb[1];
                      sVar7 = pgVar41->nb[2];
                      sVar8 = pgVar41->nb[3];
                      lVar9 = pgVar43->ne[0];
                      sVar10 = pgVar43->nb[1];
                      sVar11 = pgVar43->nb[2];
                      sVar12 = pgVar43->nb[3];
                      gVar2 = pgVar42->type;
                      iVar3 = *(int *)&pgVar42->field_0x4;
                      lVar32 = ggml_nrows(pgVar41);
                      lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                      lVar47 = (int)gVar2 * lVar33;
                      lVar33 = lVar33 + lVar47;
                      if (lVar32 <= lVar33) {
                        lVar33 = lVar32;
                      }
                      if (lVar47 < lVar33) {
                        lVar48 = lVar48 * lVar38;
                        do {
                          lVar32 = lVar47 / lVar48;
                          lVar37 = lVar47 % lVar48;
                          lVar34 = lVar37 / lVar38;
                          lVar37 = lVar37 % lVar38;
                          if (0 < lVar9) {
                            pvVar13 = pgVar43->data;
                            pvVar14 = pgVar41->data;
                            lVar35 = 0;
                            do {
                              fVar56 = cosf(*(float *)(&ggml_table_f32_f16 +
                                                      (ulong)*(ushort *)
                                                              ((long)pvVar14 +
                                                              lVar35 * 2 +
                                                              lVar34 * sVar7 +
                                                              lVar37 * sVar6 + lVar32 * sVar8) * 4))
                              ;
                              *(float *)((long)pvVar13 +
                                        lVar35 * 4 +
                                        lVar34 * sVar11 + lVar37 * sVar10 + lVar32 * sVar12) =
                                   fVar56;
                              lVar35 = lVar35 + 1;
                            } while (lVar9 != lVar35);
                          }
                          lVar47 = lVar47 + 1;
                        } while (lVar47 != lVar33);
                      }
                      return;
                    }
                    goto LAB_00131059;
                  }
LAB_0013103d:
                  pcVar36 = "nb0 == sizeof(dst_t)";
                  uVar40 = 0x55;
                  goto LAB_00131073;
                }
              }
              pcVar36 = 
              "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
              ;
              uVar40 = 0x51;
LAB_00131073:
              ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/unary-ops.cpp"
                         ,uVar40,"GGML_ASSERT(%s) failed",pcVar36);
            }
            cVar30 = ggml_is_contiguous_1(pgVar43);
            if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar42), cVar30 != '\0')) &&
               (cVar30 = ggml_are_same_shape(pgVar43,pgVar42), cVar30 != '\0')) {
              if (pgVar42->nb[0] == 4) {
                if (pgVar43->nb[0] == 2) {
                  lVar38 = pgVar43->ne[1];
                  lVar48 = pgVar43->ne[2];
                  sVar6 = pgVar43->nb[1];
                  sVar7 = pgVar43->nb[2];
                  sVar8 = pgVar43->nb[3];
                  lVar9 = pgVar42->ne[0];
                  sVar10 = pgVar42->nb[1];
                  sVar11 = pgVar42->nb[2];
                  sVar12 = pgVar42->nb[3];
                  gVar2 = pgVar41->type;
                  iVar3 = *(int *)&pgVar41->field_0x4;
                  lVar32 = ggml_nrows(pgVar43);
                  lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                  lVar47 = (int)gVar2 * lVar33;
                  lVar33 = lVar33 + lVar47;
                  if (lVar32 <= lVar33) {
                    lVar33 = lVar32;
                  }
                  if (lVar47 < lVar33) {
                    lVar48 = lVar48 * lVar38;
                    do {
                      lVar32 = lVar47 / lVar48;
                      lVar37 = lVar47 % lVar48;
                      lVar34 = lVar37 / lVar38;
                      lVar37 = lVar37 % lVar38;
                      if (0 < lVar9) {
                        pvVar13 = pgVar42->data;
                        pvVar14 = pgVar43->data;
                        lVar35 = 0;
                        do {
                          fVar56 = sinf(*(float *)(&ggml_table_f32_f16 +
                                                  (ulong)*(ushort *)
                                                          ((long)pvVar14 +
                                                          lVar35 * 2 +
                                                          lVar34 * sVar7 +
                                                          lVar37 * sVar6 + lVar32 * sVar8) * 4));
                          *(float *)((long)pvVar13 +
                                    lVar35 * 4 + lVar34 * sVar11 + lVar37 * sVar10 + lVar32 * sVar12
                                    ) = fVar56;
                          lVar35 = lVar35 + 1;
                        } while (lVar9 != lVar35);
                      }
                      lVar47 = lVar47 + 1;
                    } while (lVar47 != lVar33);
                  }
                  return;
                }
                goto LAB_001307cd;
              }
LAB_001307b1:
              pcVar36 = "nb0 == sizeof(dst_t)";
              uVar40 = 0x55;
              goto LAB_001307e7;
            }
          }
          pcVar36 = 
          "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
          ;
          uVar40 = 0x51;
LAB_001307e7:
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/unary-ops.cpp"
                     ,uVar40,"GGML_ASSERT(%s) failed",pcVar36);
        }
        cVar30 = ggml_is_contiguous_1(pgVar42);
        if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar41), cVar30 != '\0')) &&
           (cVar30 = ggml_are_same_shape(pgVar42,pgVar41), cVar30 != '\0')) {
          if (pgVar41->nb[0] == 4) {
            if (pgVar42->nb[0] == 2) {
              lVar38 = pgVar42->ne[1];
              lVar48 = pgVar42->ne[2];
              sVar6 = pgVar42->nb[1];
              sVar7 = pgVar42->nb[2];
              sVar8 = pgVar42->nb[3];
              lVar9 = pgVar41->ne[0];
              sVar10 = pgVar41->nb[1];
              sVar11 = pgVar41->nb[2];
              sVar12 = pgVar41->nb[3];
              gVar2 = dst->type;
              iVar3 = *(int *)&dst->field_0x4;
              lVar32 = ggml_nrows(pgVar42);
              lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
              lVar47 = (int)gVar2 * lVar33;
              lVar33 = lVar33 + lVar47;
              if (lVar32 <= lVar33) {
                lVar33 = lVar32;
              }
              if (lVar47 < lVar33) {
                lVar48 = lVar48 * lVar38;
                do {
                  lVar32 = lVar47 / lVar48;
                  lVar37 = lVar47 % lVar48;
                  lVar34 = lVar37 / lVar38;
                  lVar37 = lVar37 % lVar38;
                  if (0 < lVar9) {
                    pvVar13 = pgVar41->data;
                    pvVar14 = pgVar42->data;
                    lVar35 = 0;
                    do {
                      fVar56 = *(float *)(&ggml_table_f32_f16 +
                                         (ulong)*(ushort *)
                                                 ((long)pvVar14 +
                                                 lVar35 * 2 +
                                                 lVar34 * sVar7 + lVar37 * sVar6 + lVar32 * sVar8) *
                                         4);
                      if (fVar56 < 0.0) {
                        fVar56 = sqrtf(fVar56);
                      }
                      else {
                        auVar57 = vsqrtss_avx(ZEXT416((uint)fVar56),ZEXT416((uint)fVar56));
                        fVar56 = auVar57._0_4_;
                      }
                      *(float *)((long)pvVar13 +
                                lVar35 * 4 + lVar34 * sVar11 + lVar37 * sVar10 + lVar32 * sVar12) =
                           fVar56;
                      lVar35 = lVar35 + 1;
                    } while (lVar9 != lVar35);
                  }
                  lVar47 = lVar47 + 1;
                } while (lVar47 != lVar33);
              }
              return;
            }
            goto LAB_0012ff41;
          }
LAB_0012ff25:
          pcVar36 = "nb0 == sizeof(dst_t)";
          uVar40 = 0x55;
          goto LAB_0012ff5b;
        }
      }
      pcVar36 = 
      "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)";
      uVar40 = 0x51;
LAB_0012ff5b:
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/unary-ops.cpp"
                 ,uVar40,"GGML_ASSERT(%s) failed",pcVar36);
    }
    cVar30 = ggml_is_contiguous_1(pgVar41);
    if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(dst), cVar30 != '\0')) &&
       (cVar30 = ggml_are_same_shape(pgVar41,dst), cVar30 != '\0')) {
      if (dst->nb[0] == 4) {
        if (pgVar41->nb[0] == 2) {
          lVar38 = pgVar41->ne[1];
          lVar48 = pgVar41->ne[2];
          sVar6 = pgVar41->nb[1];
          sVar7 = pgVar41->nb[2];
          sVar8 = pgVar41->nb[3];
          lVar9 = dst->ne[0];
          sVar10 = dst->nb[1];
          sVar11 = dst->nb[2];
          sVar12 = dst->nb[3];
          iVar3 = params->ith;
          iVar4 = params->nth;
          lVar32 = ggml_nrows(pgVar41);
          lVar33 = ((long)iVar4 + -1 + lVar32) / (long)iVar4;
          lVar47 = iVar3 * lVar33;
          lVar33 = lVar33 + lVar47;
          if (lVar32 <= lVar33) {
            lVar33 = lVar32;
          }
          if (lVar47 < lVar33) {
            lVar48 = lVar48 * lVar38;
            pvVar13 = dst->data;
            pvVar14 = pgVar41->data;
            do {
              lVar32 = lVar47 / lVar48;
              lVar37 = lVar47 % lVar48;
              lVar34 = lVar37 / lVar38;
              lVar37 = lVar37 % lVar38;
              if (0 < lVar9) {
                lVar35 = 0;
                do {
                  *(float *)((long)pvVar13 +
                            lVar35 * 4 + lVar34 * sVar11 + lVar37 * sVar10 + lVar32 * sVar12) =
                       *(float *)(&ggml_table_f32_f16 +
                                 (ulong)*(ushort *)
                                         ((long)pvVar14 +
                                         lVar35 * 2 +
                                         lVar34 * sVar7 + lVar37 * sVar6 + lVar32 * sVar8) * 4) *
                       *(float *)(&ggml_table_f32_f16 +
                                 (ulong)*(ushort *)
                                         ((long)pvVar14 +
                                         lVar35 * 2 +
                                         lVar34 * sVar7 + lVar37 * sVar6 + lVar32 * sVar8) * 4);
                  lVar35 = lVar35 + 1;
                } while (lVar9 != lVar35);
              }
              lVar47 = lVar47 + 1;
            } while (lVar47 != lVar33);
          }
          return;
        }
        goto LAB_0012f641;
      }
LAB_0012f625:
      pcVar36 = "nb0 == sizeof(dst_t)";
      uVar40 = 0x55;
      goto LAB_0012f65b;
    }
  }
  pcVar36 = 
  "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)";
  uVar40 = 0x51;
LAB_0012f65b:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/unary-ops.cpp"
             ,uVar40,"GGML_ASSERT(%s) failed",pcVar36);
}

Assistant:

void ggml_compute_forward_sqr(const ggml_compute_params * params, ggml_tensor * dst) {
    unary_op<op_sqr>(params, dst);
}